

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * l_str2d(char *s,lua_Number *result)

{
  byte *pbVar1;
  char *pcVar2;
  size_t sVar3;
  lconv *plVar4;
  uint local_114;
  char *pdot;
  char buff [201];
  int mode;
  char *pmode;
  char *endptr;
  lua_Number *result_local;
  char *s_local;
  
  pbVar1 = (byte *)strpbrk(s,".xXnN");
  if (pbVar1 == (byte *)0x0) {
    local_114 = 0;
  }
  else {
    local_114 = *pbVar1 | 0x20;
  }
  if (local_114 == 0x6e) {
    s_local = (char *)0x0;
  }
  else {
    pmode = l_str2dloc(s,result,local_114);
    if (pmode == (char *)0x0) {
      pcVar2 = strchr(s,0x2e);
      if ((pcVar2 == (char *)0x0) || (sVar3 = strlen(s), 200 < sVar3)) {
        return (char *)0x0;
      }
      strcpy((char *)&pdot,s);
      plVar4 = localeconv();
      pcVar2[(long)(buff + (-8 - (long)s))] = *plVar4->decimal_point;
      pmode = l_str2dloc((char *)&pdot,result,local_114);
      if (pmode != (char *)0x0) {
        pmode = s + ((long)pmode - (long)&pdot);
      }
    }
    s_local = pmode;
  }
  return s_local;
}

Assistant:

static const char *l_str2d (const char *s, lua_Number *result) {
  const char *endptr;
  const char *pmode = strpbrk(s, ".xXnN");  /* look for special chars */
  int mode = pmode ? ltolower(cast_uchar(*pmode)) : 0;
  if (mode == 'n')  /* reject 'inf' and 'nan' */
    return NULL;
  endptr = l_str2dloc(s, result, mode);  /* try to convert */
  if (endptr == NULL) {  /* failed? may be a different locale */
    char buff[L_MAXLENNUM + 1];
    const char *pdot = strchr(s, '.');
    if (pdot == NULL || strlen(s) > L_MAXLENNUM)
      return NULL;  /* string too long or no dot; fail */
    strcpy(buff, s);  /* copy string to buffer */
    buff[pdot - s] = lua_getlocaledecpoint();  /* correct decimal point */
    endptr = l_str2dloc(buff, result, mode);  /* try again */
    if (endptr != NULL)
      endptr = s + (endptr - buff);  /* make relative to 's' */
  }
  return endptr;
}